

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O3

ON__LayerPerViewSettings * __thiscall
ON__LayerExtensions::ViewportSettings
          (ON__LayerExtensions *this,ON_Layer *layer,uchar *layer_m_extension_bits,
          ON_UUID viewport_id,bool bCreate)

{
  int iVar1;
  bool bVar2;
  ON__LayerExtensions *pOVar3;
  ON__LayerPerViewSettings *this_00;
  ON__LayerPerViewSettings *pOVar4;
  long lVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 local_40;
  uchar auStack_38 [8];
  
  auStack_38 = viewport_id._0_8_;
  local_40 = layer_m_extension_bits;
  bVar2 = ON_UuidIsNil((ON_UUID *)&local_40);
  if ((!bVar2) &&
     (pOVar3 = LayerExtensions((ON_Layer *)this,(uchar *)layer,viewport_id.Data4[0]),
     pOVar3 != (ON__LayerExtensions *)0x0)) {
    iVar1 = (pOVar3->m_vp_settings).m_count;
    lVar5 = (long)iVar1;
    if (0 < lVar5) {
      pOVar4 = (pOVar3->m_vp_settings).m_a;
      do {
        auVar7[0] = -((char)(pOVar4->m_viewport_id).Data1 == (char)local_40);
        auVar7[1] = -(*(char *)((long)&(pOVar4->m_viewport_id).Data1 + 1) == local_40._1_1_);
        auVar7[2] = -(*(char *)((long)&(pOVar4->m_viewport_id).Data1 + 2) == local_40._2_1_);
        auVar7[3] = -(*(char *)((long)&(pOVar4->m_viewport_id).Data1 + 3) == local_40._3_1_);
        auVar7[4] = -((char)(pOVar4->m_viewport_id).Data2 == local_40._4_1_);
        auVar7[5] = -(*(char *)((long)&(pOVar4->m_viewport_id).Data2 + 1) == local_40._5_1_);
        auVar7[6] = -((char)(pOVar4->m_viewport_id).Data3 == local_40._6_1_);
        auVar7[7] = -(*(char *)((long)&(pOVar4->m_viewport_id).Data3 + 1) == local_40._7_1_);
        auVar7[8] = -((pOVar4->m_viewport_id).Data4[0] == auStack_38[0]);
        auVar7[9] = -((pOVar4->m_viewport_id).Data4[1] == auStack_38[1]);
        auVar7[10] = -((pOVar4->m_viewport_id).Data4[2] == auStack_38[2]);
        auVar7[0xb] = -((pOVar4->m_viewport_id).Data4[3] == auStack_38[3]);
        auVar7[0xc] = -((pOVar4->m_viewport_id).Data4[4] == auStack_38[4]);
        auVar7[0xd] = -((pOVar4->m_viewport_id).Data4[5] == auStack_38[5]);
        auVar7[0xe] = -((pOVar4->m_viewport_id).Data4[6] == auStack_38[6]);
        auVar7[0xf] = -((pOVar4->m_viewport_id).Data4[7] == auStack_38[7]);
        if ((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar7[0xf] >> 7) << 0xf) == 0xffff) {
          return pOVar4;
        }
        pOVar4 = pOVar4 + 1;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    if (viewport_id.Data4[0] != false) {
      this_00 = ON_SimpleArray<ON__LayerPerViewSettings>::AppendNew(&pOVar3->m_vp_settings);
      pOVar4 = (pOVar3->m_vp_settings).m_a;
      ON__LayerPerViewSettings::SetDefaultValues(this_00);
      *(uchar **)&this_00->m_viewport_id = local_40;
      *&(this_00->m_viewport_id).Data4 = auStack_38;
      ON_SimpleArray<ON__LayerPerViewSettings>::QuickSort
                (&pOVar3->m_vp_settings,ON__LayerPerViewSettings::Compare);
      if (-1 < iVar1) {
        uVar6 = (ulong)(iVar1 + 1);
        do {
          auVar8[0] = -((char)(pOVar4->m_viewport_id).Data1 == (char)local_40);
          auVar8[1] = -(*(char *)((long)&(pOVar4->m_viewport_id).Data1 + 1) == local_40._1_1_);
          auVar8[2] = -(*(char *)((long)&(pOVar4->m_viewport_id).Data1 + 2) == local_40._2_1_);
          auVar8[3] = -(*(char *)((long)&(pOVar4->m_viewport_id).Data1 + 3) == local_40._3_1_);
          auVar8[4] = -((char)(pOVar4->m_viewport_id).Data2 == local_40._4_1_);
          auVar8[5] = -(*(char *)((long)&(pOVar4->m_viewport_id).Data2 + 1) == local_40._5_1_);
          auVar8[6] = -((char)(pOVar4->m_viewport_id).Data3 == local_40._6_1_);
          auVar8[7] = -(*(char *)((long)&(pOVar4->m_viewport_id).Data3 + 1) == local_40._7_1_);
          auVar8[8] = -((pOVar4->m_viewport_id).Data4[0] == auStack_38[0]);
          auVar8[9] = -((pOVar4->m_viewport_id).Data4[1] == auStack_38[1]);
          auVar8[10] = -((pOVar4->m_viewport_id).Data4[2] == auStack_38[2]);
          auVar8[0xb] = -((pOVar4->m_viewport_id).Data4[3] == auStack_38[3]);
          auVar8[0xc] = -((pOVar4->m_viewport_id).Data4[4] == auStack_38[4]);
          auVar8[0xd] = -((pOVar4->m_viewport_id).Data4[5] == auStack_38[5]);
          auVar8[0xe] = -((pOVar4->m_viewport_id).Data4[6] == auStack_38[6]);
          auVar8[0xf] = -((pOVar4->m_viewport_id).Data4[7] == auStack_38[7]);
          if ((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe |
                      (ushort)(auVar8[0xf] >> 7) << 0xf) == 0xffff) {
            return pOVar4;
          }
          pOVar4 = pOVar4 + 1;
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
      }
    }
  }
  return (ON__LayerPerViewSettings *)0x0;
}

Assistant:

ON__LayerPerViewSettings* ON__LayerExtensions::ViewportSettings( 
  const ON_Layer& layer,
  const unsigned char* layer_m_extension_bits,
  ON_UUID viewport_id,
  bool bCreate
  )
{
  if ( !ON_UuidIsNil(viewport_id) )
  {
    ON__LayerExtensions* ud = ON__LayerExtensions::LayerExtensions(layer,layer_m_extension_bits,bCreate);
    if ( ud )
    {
      int i;
      const int vp_settings_count = ud->m_vp_settings.Count();
      ON__LayerPerViewSettings* vp_settings = ud->m_vp_settings.Array();
      for ( i = 0; i < vp_settings_count; i++ )
      {
        if ( 0 == memcmp(&viewport_id,&vp_settings[i].m_viewport_id,sizeof(ON_UUID)) )
          return (vp_settings+i);
      }
      if ( bCreate )
      {
        ON__LayerPerViewSettings& new_vp_settings = ud->m_vp_settings.AppendNew();
        vp_settings = ud->m_vp_settings.Array(); // appending can grow the array
        new_vp_settings.SetDefaultValues();
        new_vp_settings.m_viewport_id = viewport_id;

        // to make ON_Layer::PerViewportSettingsCRC() return
        // equal values for equal settings, it is critical
        // that m_vp_settings[] be sorted.
        ud->m_vp_settings.QuickSort(ON__LayerPerViewSettings::Compare);

        for ( i = 0; i <= vp_settings_count; i++ ) // "i <= ..." is correct because of the .AppendNew()
        {
          if ( 0 == memcmp(&viewport_id,&vp_settings[i].m_viewport_id,sizeof(ON_UUID)) )
            return (vp_settings+i);
        }
      }
    }
  }
  return 0;
}